

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack4.h
# Opt level: O0

void ncnn::padding_replicate_pack4_sse(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  int x_8;
  int x_7;
  int x_6;
  __m128 _p_2;
  float *ptr0_1;
  int y_2;
  int x_5;
  int x_4;
  int x_3;
  __m128 _p_1;
  int y_1;
  int x_2;
  int x_1;
  int x;
  __m128 _p;
  float *ptr0;
  int y;
  float *outptr;
  float *ptr;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float *local_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  float *local_188;
  int local_17c;
  float *local_178;
  float *local_170;
  
  local_170 = Mat::operator_cast_to_float_(in_RDI);
  local_178 = Mat::operator_cast_to_float_(in_RSI);
  for (local_17c = 0; local_17c < in_EDX; local_17c = local_17c + 1) {
    local_198 = *(undefined8 *)local_170;
    uStack_190 = *(undefined8 *)(local_170 + 2);
    for (local_19c = 0; local_19c < in_R8D; local_19c = local_19c + 1) {
      *(undefined8 *)local_178 = local_198;
      *(undefined8 *)(local_178 + 2) = uStack_190;
      local_178 = local_178 + 4;
    }
    local_188 = local_170;
    for (local_1a0 = 0; local_1a0 < in_RDI->w; local_1a0 = local_1a0 + 1) {
      local_198 = *(undefined8 *)local_188;
      uStack_190 = *(undefined8 *)(local_188 + 2);
      *(undefined8 *)local_178 = local_198;
      *(undefined8 *)(local_178 + 2) = uStack_190;
      local_188 = local_188 + 4;
      local_178 = local_178 + 4;
    }
    for (local_1a4 = 0; local_1a4 < in_R9D; local_1a4 = local_1a4 + 1) {
      *(undefined8 *)local_178 = local_198;
      *(undefined8 *)(local_178 + 2) = uStack_190;
      local_178 = local_178 + 4;
    }
  }
  for (local_1a8 = 0; local_1a8 < in_RDI->h; local_1a8 = local_1a8 + 1) {
    local_1b8 = *(undefined8 *)local_170;
    uStack_1b0 = *(undefined8 *)(local_170 + 2);
    for (local_1bc = 0; local_1bc < in_R8D; local_1bc = local_1bc + 1) {
      *(undefined8 *)local_178 = local_1b8;
      *(undefined8 *)(local_178 + 2) = uStack_1b0;
      local_178 = local_178 + 4;
    }
    for (local_1c0 = 0; local_1c0 < in_RDI->w; local_1c0 = local_1c0 + 1) {
      local_1b8 = *(undefined8 *)local_170;
      uStack_1b0 = *(undefined8 *)(local_170 + 2);
      *(undefined8 *)local_178 = local_1b8;
      *(undefined8 *)(local_178 + 2) = uStack_1b0;
      local_170 = local_170 + 4;
      local_178 = local_178 + 4;
    }
    for (local_1c4 = 0; local_1c4 < in_R9D; local_1c4 = local_1c4 + 1) {
      *(undefined8 *)local_178 = local_1b8;
      *(undefined8 *)(local_178 + 2) = uStack_1b0;
      local_178 = local_178 + 4;
    }
  }
  local_170 = local_170 + -(long)(in_RDI->w << 2);
  for (local_1c8 = 0; local_1c8 < in_ECX; local_1c8 = local_1c8 + 1) {
    local_1e8 = *(undefined8 *)local_170;
    uStack_1e0 = *(undefined8 *)(local_170 + 2);
    for (local_1ec = 0; local_1ec < in_R8D; local_1ec = local_1ec + 1) {
      *(undefined8 *)local_178 = local_1e8;
      *(undefined8 *)(local_178 + 2) = uStack_1e0;
      local_178 = local_178 + 4;
    }
    local_1d0 = local_170;
    for (local_1f0 = 0; local_1f0 < in_RDI->w; local_1f0 = local_1f0 + 1) {
      local_1e8 = *(undefined8 *)local_1d0;
      uStack_1e0 = *(undefined8 *)(local_1d0 + 2);
      *(undefined8 *)local_178 = local_1e8;
      *(undefined8 *)(local_178 + 2) = uStack_1e0;
      local_1d0 = local_1d0 + 4;
      local_178 = local_178 + 4;
    }
    for (local_1f4 = 0; local_1f4 < in_R9D; local_1f4 = local_1f4 + 1) {
      *(undefined8 *)local_178 = local_1e8;
      *(undefined8 *)(local_178 + 2) = uStack_1e0;
      local_178 = local_178 + 4;
    }
  }
  return;
}

Assistant:

static void padding_replicate_pack4_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const float* ptr = src;
    float* outptr = dst;

    // fill top
    for (int y = 0; y < top; y++)
    {
        const float* ptr0 = ptr;
        __m128 _p = _mm_loadu_ps(ptr0);
        for (int x = 0; x < left; x++)
        {
            _mm_storeu_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm_loadu_ps(ptr0);
            _mm_storeu_ps(outptr, _p);
            ptr0 += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            _mm_storeu_ps(outptr, _p);
            outptr += 4;
        }
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        for (int x = 0; x < left; x++)
        {
            _mm_storeu_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            _mm_storeu_ps(outptr, _p);
            outptr += 4;
        }
    }
    // fill bottom
    ptr -= src.w * 4;
    for (int y = 0; y < bottom; y++)
    {
        const float* ptr0 = ptr;
        __m128 _p = _mm_loadu_ps(ptr0);
        for (int x = 0; x < left; x++)
        {
            _mm_storeu_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm_loadu_ps(ptr0);
            _mm_storeu_ps(outptr, _p);
            ptr0 += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            _mm_storeu_ps(outptr, _p);
            outptr += 4;
        }
    }
}